

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O3

bool __thiscall argagg::option_result::as<bool>(option_result *this,bool *t)

{
  int iVar1;
  undefined1 uVar2;
  
  if (this->arg == (char *)0x0) {
    uVar2 = *t;
  }
  else {
    iVar1 = convert::long_<int>(this->arg);
    uVar2 = iVar1 != 0;
  }
  return (bool)uVar2;
}

Assistant:

T option_result::as(const T& t) const
{
  if (this->arg) {
    try {
      return convert::arg<T>(this->arg);
    } catch (...) {
      return t;
    }
  } else {
    // I actually think this will never happen. To call this method you have
    // to access a specific option_result for an option. If there's a
    // specific option_result then the option was found. If the option
    // requires an argument then it will definitely have an argument
    // otherwise the parser would have complained.
    return t;
  }
}